

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_ref.c
# Opt level: O0

void randomx_argon2_fill_segment_ref(argon2_instance_t *instance,argon2_position_t position)

{
  ulong uVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  argon2_instance_t *in_RDI;
  uint32_t i;
  uint32_t starting_index;
  uint32_t curr_offset;
  uint32_t prev_offset;
  uint64_t ref_lane;
  uint64_t ref_index;
  uint64_t pseudo_rand;
  block zero_block;
  block input_block;
  block address_block;
  block *curr_block;
  block *ref_block;
  uint local_c50;
  uint local_c4c;
  uint local_c48;
  uint local_c44;
  ulong local_c40;
  int in_stack_fffffffffffffbac;
  block *in_stack_fffffffffffffbb0;
  block *in_stack_fffffffffffffbb8;
  block *in_stack_fffffffffffffbc0;
  argon2_position_t local_10;
  
  if (in_RDI != (argon2_instance_t *)0x0) {
    local_c4c = 0;
    local_10.pass = (uint32_t)in_RSI;
    local_10.slice = (uint8_t)in_RDX;
    if ((local_10.pass == 0) && (local_10.slice == 0)) {
      local_c4c = 2;
    }
    local_10.lane = SUB84(in_RSI,4);
    local_c48 = local_10.lane * in_RDI->lane_length + (uint)local_10.slice * in_RDI->segment_length
                + local_c4c;
    local_c44 = local_c48;
    if (local_c48 % in_RDI->lane_length == 0) {
      local_c44 = local_c48 + in_RDI->lane_length;
    }
    local_c44 = local_c44 - 1;
    local_10._0_8_ = in_RSI;
    local_10._8_8_ = in_RDX;
    for (local_c50 = local_c4c; local_c50 < in_RDI->segment_length; local_c50 = local_c50 + 1) {
      if (local_c48 % in_RDI->lane_length == 1) {
        local_c44 = local_c48 - 1;
      }
      uVar1 = in_RDI->memory[local_c44].v[0];
      local_c40 = (uVar1 >> 0x20) % (ulong)in_RDI->lanes;
      if ((local_10.pass == 0) && (local_10.slice == '\0')) {
        local_c40 = (ulong)local_10.lane;
      }
      local_10.index = local_c50;
      randomx_argon2_index_alpha
                (in_RDI,&local_10,(uint32_t)uVar1,(uint)(local_c40 == local_10.lane));
      if (in_RDI->version == 0x10) {
        fill_block(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
                   in_stack_fffffffffffffbac);
      }
      else if (local_10.pass == 0) {
        fill_block(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
                   in_stack_fffffffffffffbac);
      }
      else {
        fill_block(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
                   in_stack_fffffffffffffbac);
      }
      local_c48 = local_c48 + 1;
      local_c44 = local_c44 + 1;
    }
  }
  return;
}

Assistant:

void randomx_argon2_fill_segment_ref(const argon2_instance_t *instance,
	argon2_position_t position) {
	block *ref_block = NULL, *curr_block = NULL;
	block address_block, input_block, zero_block;
	uint64_t pseudo_rand, ref_index, ref_lane;
	uint32_t prev_offset, curr_offset;
	uint32_t starting_index;
	uint32_t i;

	if (instance == NULL) {
		return;
	}

	starting_index = 0;

	if ((0 == position.pass) && (0 == position.slice)) {
		starting_index = 2; /* we have already generated the first two blocks */
	}

	/* Offset of the current block */
	curr_offset = position.lane * instance->lane_length +
		position.slice * instance->segment_length + starting_index;

	if (0 == curr_offset % instance->lane_length) {
		/* Last block in this lane */
		prev_offset = curr_offset + instance->lane_length - 1;
	}
	else {
		/* Previous block */
		prev_offset = curr_offset - 1;
	}

	for (i = starting_index; i < instance->segment_length;
		++i, ++curr_offset, ++prev_offset) {
		/*1.1 Rotating prev_offset if needed */
		if (curr_offset % instance->lane_length == 1) {
			prev_offset = curr_offset - 1;
		}

		/* 1.2 Computing the index of the reference block */
		/* 1.2.1 Taking pseudo-random value from the previous block */
		pseudo_rand = instance->memory[prev_offset].v[0];

		/* 1.2.2 Computing the lane of the reference block */
		ref_lane = ((pseudo_rand >> 32)) % instance->lanes;

		if ((position.pass == 0) && (position.slice == 0)) {
			/* Can not reference other lanes yet */
			ref_lane = position.lane;
		}

		/* 1.2.3 Computing the number of possible reference block within the
		 * lane.
		 */
		position.index = i;
		ref_index = randomx_argon2_index_alpha(instance, &position, pseudo_rand & 0xFFFFFFFF,
			ref_lane == position.lane);

		/* 2 Creating a new block */
		ref_block =
			instance->memory + instance->lane_length * ref_lane + ref_index;
		curr_block = instance->memory + curr_offset;
		if (ARGON2_VERSION_10 == instance->version) {
			/* version 1.2.1 and earlier: overwrite, not XOR */
			fill_block(instance->memory + prev_offset, ref_block, curr_block, 0);
		}
		else {
			if (0 == position.pass) {
				fill_block(instance->memory + prev_offset, ref_block,
					curr_block, 0);
			}
			else {
				fill_block(instance->memory + prev_offset, ref_block,
					curr_block, 1);
			}
		}
	}
}